

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O1

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:306:25)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:306:25)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  FileName local_58;
  FileName local_38;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getFileName(&local_58,this_00);
  FileName::operator+(&local_38,path,&local_58);
  std::vector<embree::FileName,_std::allocator<embree::FileName>_>::emplace_back<embree::FileName>
            (&pSVar1->sceneFilename,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.filename._M_dataplus._M_p != &local_38.filename.field_2) {
    operator_delete(local_38.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != &local_58.filename.field_2) {
    operator_delete(local_58.filename._M_dataplus._M_p);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }